

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O1

int secp256k1_musig_partial_sig_verify
              (secp256k1_context *ctx,secp256k1_musig_partial_sig *partial_sig,
              secp256k1_musig_pubnonce *pubnonce,secp256k1_pubkey *pubkey,
              secp256k1_musig_keyagg_cache *keyagg_cache,secp256k1_musig_session *session)

{
  int iVar1;
  secp256k1_ge pkp;
  secp256k1_scalar e;
  secp256k1_scalar s;
  secp256k1_scalar mu;
  secp256k1_musig_session_internal session_i;
  secp256k1_gej rj;
  secp256k1_gej tmp;
  secp256k1_keyagg_cache_internal cache_i;
  secp256k1_ge nonce_pts [2];
  secp256k1_gej pkj;
  secp256k1_fe aux [8];
  secp256k1_ge pre_a [8];
  secp256k1_strauss_point_state ps [1];
  secp256k1_ge local_cc8;
  secp256k1_scalar local_c70;
  secp256k1_scalar local_c50;
  secp256k1_strauss_state local_c30;
  secp256k1_scalar local_c18;
  secp256k1_musig_session_internal local_bf8;
  secp256k1_gej local_b70;
  secp256k1_gej local_af0;
  secp256k1_keyagg_cache_internal local_a70;
  secp256k1_ge local_978 [2];
  secp256k1_gej local_8c8;
  secp256k1_fe local_848 [8];
  secp256k1_ge local_708 [8];
  secp256k1_strauss_point_state local_448;
  
  if (partial_sig == (secp256k1_musig_partial_sig *)0x0) {
    secp256k1_musig_partial_sig_verify_cold_5();
  }
  else if (pubnonce == (secp256k1_musig_pubnonce *)0x0) {
    secp256k1_musig_partial_sig_verify_cold_4();
  }
  else if (pubkey == (secp256k1_pubkey *)0x0) {
    secp256k1_musig_partial_sig_verify_cold_3();
  }
  else if (keyagg_cache == (secp256k1_musig_keyagg_cache *)0x0) {
    secp256k1_musig_partial_sig_verify_cold_2();
  }
  else {
    if (session != (secp256k1_musig_session *)0x0) {
      iVar1 = secp256k1_musig_session_load(ctx,&local_bf8,session);
      if (iVar1 == 0) {
        return 0;
      }
      iVar1 = secp256k1_musig_pubnonce_load(ctx,local_978,pubnonce);
      if (iVar1 == 0) {
        return 0;
      }
      secp256k1_effective_nonce(&local_b70,local_978,&local_bf8.noncecoef);
      iVar1 = secp256k1_pubkey_load(ctx,&local_cc8,pubkey);
      if (iVar1 == 0) {
        return 0;
      }
      iVar1 = secp256k1_keyagg_cache_load(ctx,&local_a70,keyagg_cache);
      if (iVar1 == 0) {
        return 0;
      }
      secp256k1_musig_keyaggcoef_internal
                (&local_c18,local_a70.pks_hash,&local_cc8,&local_a70.second_pk);
      secp256k1_scalar_mul(&local_c70,&local_bf8.challenge,&local_c18);
      if (((uint)local_a70.pk.y.n[0] & 1) != local_a70.parity_acc) {
        secp256k1_scalar_negate(&local_c70,&local_c70);
      }
      iVar1 = secp256k1_musig_partial_sig_load(ctx,&local_c50,partial_sig);
      if (iVar1 == 0) {
        return 0;
      }
      secp256k1_scalar_negate(&local_c50,&local_c50);
      local_8c8.infinity = local_cc8.infinity;
      local_8c8.x.n[0] = local_cc8.x.n[0];
      local_8c8.x.n[1] = local_cc8.x.n[1];
      local_8c8.x.n[2] = local_cc8.x.n[2];
      local_8c8.x.n[3] = local_cc8.x.n[3];
      local_8c8.x.n[4] = local_cc8.x.n[4];
      local_8c8.y.n[0] = local_cc8.y.n[0];
      local_8c8.y.n[1] = local_cc8.y.n[1];
      local_8c8.y.n[2] = local_cc8.y.n[2];
      local_8c8.y.n[3] = local_cc8.y.n[3];
      local_8c8.y.n[4] = local_cc8.y.n[4];
      local_8c8.z.n[0] = 1;
      local_8c8.z.n[1] = 0;
      local_8c8.z.n[2] = 0;
      local_8c8.z.n[3] = 0;
      local_8c8.z.n[4] = 0;
      local_c30.aux = local_848;
      local_c30.pre_a = local_708;
      local_c30.ps = &local_448;
      secp256k1_ecmult_strauss_wnaf(&local_c30,&local_af0,1,&local_8c8,&local_c70,&local_c50);
      if (local_bf8.fin_nonce_parity != 0) {
        secp256k1_gej_neg(&local_b70,&local_b70);
      }
      secp256k1_gej_add_var(&local_af0,&local_af0,&local_b70,(secp256k1_fe *)0x0);
      return local_af0.infinity;
    }
    secp256k1_musig_partial_sig_verify_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_musig_partial_sig_verify(const secp256k1_context* ctx, const secp256k1_musig_partial_sig *partial_sig, const secp256k1_musig_pubnonce *pubnonce, const secp256k1_pubkey *pubkey, const secp256k1_musig_keyagg_cache *keyagg_cache, const secp256k1_musig_session *session) {
    secp256k1_keyagg_cache_internal cache_i;
    secp256k1_musig_session_internal session_i;
    secp256k1_scalar mu, e, s;
    secp256k1_gej pkj;
    secp256k1_ge nonce_pts[2];
    secp256k1_gej rj;
    secp256k1_gej tmp;
    secp256k1_ge pkp;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(partial_sig != NULL);
    ARG_CHECK(pubnonce != NULL);
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK(keyagg_cache != NULL);
    ARG_CHECK(session != NULL);

    if (!secp256k1_musig_session_load(ctx, &session_i, session)) {
        return 0;
    }

    if (!secp256k1_musig_pubnonce_load(ctx, nonce_pts, pubnonce)) {
        return 0;
    }
    /* Compute "effective" nonce rj = nonce_pts[0] + b*nonce_pts[1] */
    /* TODO: use multiexp to compute -s*G + e*mu*pubkey + nonce_pts[0] + b*nonce_pts[1] */
    secp256k1_effective_nonce(&rj, nonce_pts, &session_i.noncecoef);

    if (!secp256k1_pubkey_load(ctx, &pkp, pubkey)) {
        return 0;
    }
    if (!secp256k1_keyagg_cache_load(ctx, &cache_i, keyagg_cache)) {
        return 0;
    }
    /* Multiplying the challenge by the KeyAgg coefficient is equivalent
     * to multiplying the signer's public key by the coefficient, except
     * much easier to do. */
    secp256k1_musig_keyaggcoef(&mu, &cache_i, &pkp);
    secp256k1_scalar_mul(&e, &session_i.challenge, &mu);

    /* Negate e if secp256k1_fe_is_odd(&cache_i.pk.y)) XOR cache_i.parity_acc.
     * This corresponds to the line "Let g' = g⋅gacc mod n" and the multiplication "g'⋅e"
     * in the specification. */
    if (secp256k1_fe_is_odd(&cache_i.pk.y)
            != cache_i.parity_acc) {
        secp256k1_scalar_negate(&e, &e);
    }

    if (!secp256k1_musig_partial_sig_load(ctx, &s, partial_sig)) {
        return 0;
    }
    /* Compute -s*G + e*pkj + rj (e already includes the keyagg coefficient mu) */
    secp256k1_scalar_negate(&s, &s);
    secp256k1_gej_set_ge(&pkj, &pkp);
    secp256k1_ecmult(&tmp, &pkj, &e, &s);
    if (session_i.fin_nonce_parity) {
        secp256k1_gej_neg(&rj, &rj);
    }
    secp256k1_gej_add_var(&tmp, &tmp, &rj, NULL);

    return secp256k1_gej_is_infinity(&tmp);
}